

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O1

void __thiscall
ruckig::BrakeProfile::acceleration_brake
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double aMax,double aMin,
          double jMax)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  (this->j)._M_elems[0] = -jMax;
  dVar4 = (a0 - (a0 / jMax) * jMax * 0.5) * (a0 / jMax) + v0;
  if (((jMax <= -jMax) || (dVar4 <= vMax)) && ((0.0 <= jMax || (vMax <= dVar4)))) {
    dVar2 = (a0 - aMax) / jMax;
    dVar4 = (a0 - dVar2 * jMax * 0.5) * dVar2 + v0;
    if ((jMax <= 0.0 || vMin <= dVar4) && (0.0 <= jMax || dVar4 <= vMin)) {
      (this->t)._M_elems[0] = dVar2 + 2.2e-14;
      return;
    }
    dVar3 = -(dVar4 - vMin) / aMax;
    dVar4 = (-aMax / (jMax + jMax) - (dVar4 - vMax) / aMax) + -2.2e-14;
    (this->t)._M_elems[0] = dVar2 + 2.2e-14;
    if (dVar3 <= dVar4) {
      dVar4 = dVar3;
    }
    dVar2 = 0.0;
    if (0.0 <= dVar4) {
      dVar2 = dVar4;
    }
    (this->t)._M_elems[1] = dVar2;
    return;
  }
  (this->j)._M_elems[0] = -jMax;
  dVar4 = (v0 - vMax) * (jMax + jMax) + a0 * a0;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar3 = (a0 - aMin) / jMax;
  dVar2 = dVar4 / ABS(jMax) + a0 / jMax;
  dVar4 = (v0 - vMin) * jMax + a0 * a0 * 0.5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = a0 / jMax + dVar4 / ABS(jMax);
  if (dVar2 <= dVar4) {
    dVar4 = dVar2;
  }
  if (dVar4 <= dVar3) {
    dVar4 = dVar4 + -2.2e-14;
    lVar1 = 8;
  }
  else {
    dVar4 = (-jMax * dVar3 * 0.5 + a0) * dVar3 + v0;
    dVar2 = -(dVar4 - vMax) / aMin;
    dVar4 = aMin / (jMax + jMax) - (dVar4 - vMin) / aMin;
    if (dVar2 <= dVar4) {
      dVar4 = dVar2;
    }
    dVar2 = 0.0;
    if (0.0 <= dVar3 + -2.2e-14) {
      dVar2 = dVar3 + -2.2e-14;
    }
    (this->t)._M_elems[0] = dVar2;
    lVar1 = 0x10;
  }
  dVar2 = 0.0;
  if (0.0 <= dVar4) {
    dVar2 = dVar4;
  }
  *(double *)((long)(this->t)._M_elems + lVar1 + -8) = dVar2;
  return;
}

Assistant:

void BrakeProfile::acceleration_brake(double v0, double a0, double vMax, double vMin, double aMax, double aMin, double jMax) {
    j[0] = -jMax;

    const double t_to_a_max = (a0 - aMax) / jMax;
    const double t_to_a_zero = a0 / jMax;

    const double v_at_a_max = v_at_t(v0, a0, -jMax, t_to_a_max);
    const double v_at_a_zero = v_at_t(v0, a0, -jMax, t_to_a_zero);

    if ((v_at_a_zero > vMax && jMax > 0) || (v_at_a_zero < vMax && jMax < 0)) {
        velocity_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if ((v_at_a_max < vMin && jMax > 0) || (v_at_a_max > vMin && jMax < 0)) {
        const double t_to_v_min = -(v_at_a_max - vMin)/aMax;
        const double t_to_v_max = -aMax/(2*jMax) - (v_at_a_max - vMax)/aMax;

        t[0] = t_to_a_max + eps;
        t[1] = std::max(std::min(t_to_v_min, t_to_v_max - eps), 0.0);

    } else {
        t[0] = t_to_a_max + eps;
    }
}